

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O3

tuple<int,_int> __thiscall Maze::adjacentCells(Maze *this,int row,int column)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  uint in_ECX;
  long lVar4;
  long lVar5;
  undefined4 in_register_00000034;
  long lVar6;
  ulong uVar7;
  ulong __n;
  uint uVar8;
  ulong uVar9;
  reference rVar10;
  
  lVar6 = CONCAT44(in_register_00000034,row);
  uVar8 = column + 1;
  uVar7 = (ulong)(int)uVar8;
  lVar4 = *(long *)(lVar6 + 0x58);
  lVar5 = *(long *)(lVar6 + 0x60);
  uVar2 = (lVar5 - lVar4 >> 3) * -0x5555555555555555;
  uVar9 = (ulong)(int)in_ECX;
  if (uVar7 <= uVar2 && uVar2 - uVar7 != 0) {
    lVar1 = *(long *)(lVar4 + uVar7 * 0x18);
    uVar3 = *(long *)(lVar4 + 8 + uVar7 * 0x18) - lVar1;
    uVar2 = uVar9;
    if (uVar3 <= uVar9) goto LAB_001032a0;
    if (*(char *)(lVar1 + uVar9) == '0') {
      uVar3 = (*(long *)(lVar6 + 0x90) - *(long *)(lVar6 + 0x88) >> 3) * -0x3333333333333333;
      uVar2 = uVar7;
      if (uVar3 < uVar7 || uVar3 - uVar7 == 0) goto LAB_001032a0;
      rVar10 = std::vector<bool,_std::allocator<bool>_>::at
                         ((vector<bool,_std::allocator<bool>_> *)
                          (*(long *)(lVar6 + 0x88) + uVar7 * 0x28),uVar9);
      if ((*rVar10._M_p & rVar10._M_mask) == 0) goto LAB_00103247;
      lVar4 = *(long *)(lVar6 + 0x58);
      lVar5 = *(long *)(lVar6 + 0x60);
    }
  }
  if (0 < column) {
    uVar8 = column - 1;
    uVar7 = (ulong)uVar8;
    uVar3 = (lVar5 - lVar4 >> 3) * -0x5555555555555555;
    uVar2 = uVar7;
    if (uVar3 < uVar7 || uVar3 - uVar7 == 0) goto LAB_001032a0;
    lVar1 = *(long *)(lVar4 + uVar7 * 0x18);
    uVar3 = *(long *)(lVar4 + 8 + uVar7 * 0x18) - lVar1;
    uVar2 = uVar9;
    if (uVar3 <= uVar9) goto LAB_001032a0;
    if (*(char *)(lVar1 + uVar9) == '0') {
      uVar3 = (*(long *)(lVar6 + 0x90) - *(long *)(lVar6 + 0x88) >> 3) * -0x3333333333333333;
      uVar2 = uVar7;
      if (uVar3 < uVar7 || uVar3 - uVar7 == 0) goto LAB_001032a0;
      rVar10 = std::vector<bool,_std::allocator<bool>_>::at
                         ((vector<bool,_std::allocator<bool>_> *)
                          (*(long *)(lVar6 + 0x88) + uVar7 * 0x28),uVar9);
      if ((*rVar10._M_p & rVar10._M_mask) == 0) goto LAB_00103247;
      lVar4 = *(long *)(lVar6 + 0x58);
      lVar5 = *(long *)(lVar6 + 0x60);
    }
  }
  uVar7 = (ulong)column;
  uVar8 = column;
  if (0 < (int)in_ECX) {
    uVar3 = (lVar5 - lVar4 >> 3) * -0x5555555555555555;
    uVar2 = uVar7;
    if (uVar3 < uVar7 || uVar3 - uVar7 == 0) goto LAB_001032a0;
    in_ECX = in_ECX - 1;
    __n = (ulong)in_ECX;
    lVar1 = *(long *)(lVar4 + uVar7 * 0x18);
    uVar3 = *(long *)(lVar4 + 8 + uVar7 * 0x18) - lVar1;
    uVar2 = __n;
    if (uVar3 <= __n) goto LAB_001032a0;
    if (*(char *)(lVar1 + __n) == '0') {
      uVar3 = (*(long *)(lVar6 + 0x90) - *(long *)(lVar6 + 0x88) >> 3) * -0x3333333333333333;
      uVar2 = uVar7;
      if (uVar3 < uVar7 || uVar3 - uVar7 == 0) goto LAB_001032a0;
      rVar10 = std::vector<bool,_std::allocator<bool>_>::at
                         ((vector<bool,_std::allocator<bool>_> *)
                          (*(long *)(lVar6 + 0x88) + uVar7 * 0x28),__n);
      if ((*rVar10._M_p & rVar10._M_mask) == 0) goto LAB_00103247;
      lVar4 = *(long *)(lVar6 + 0x58);
      lVar5 = *(long *)(lVar6 + 0x60);
    }
  }
  uVar3 = (lVar5 - lVar4 >> 3) * -0x5555555555555555;
  uVar2 = uVar7;
  if (uVar3 < uVar7 || uVar3 - uVar7 == 0) {
LAB_001032a0:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar2,
               uVar3);
  }
  uVar9 = uVar9 + 1;
  lVar5 = *(long *)(lVar4 + uVar7 * 0x18);
  if ((uVar9 < (ulong)(*(long *)(lVar4 + 8 + uVar7 * 0x18) - lVar5)) &&
     (*(char *)(lVar5 + uVar9) == '0')) {
    uVar3 = (*(long *)(lVar6 + 0x90) - *(long *)(lVar6 + 0x88) >> 3) * -0x3333333333333333;
    if (uVar3 < uVar7 || uVar3 - uVar7 == 0) goto LAB_001032a0;
    rVar10 = std::vector<bool,_std::allocator<bool>_>::at
                       ((vector<bool,_std::allocator<bool>_> *)
                        (*(long *)(lVar6 + 0x88) + uVar7 * 0x28),uVar9);
    if ((*rVar10._M_p & rVar10._M_mask) == 0) {
      in_ECX = (uint)uVar9;
      goto LAB_00103247;
    }
  }
  in_ECX = 0xffffffff;
  uVar8 = 0xffffffff;
LAB_00103247:
  *(uint *)&(this->pathStack).c.
            super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
            super__Deque_impl_data._M_map = in_ECX;
  *(uint *)((long)&(this->pathStack).c.
                   super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                   _M_impl.super__Deque_impl_data._M_map + 4) = uVar8;
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
}

Assistant:

std::tuple<int, int> Maze::adjacentCells (int row, int column){
    //if theirs a successor return it's index, otherwise return somthing invalid.

    std::tuple<int, int> NoSuccessor = std::make_tuple(-1,-1);
    if(row+1<MazeMatrix.size() && MazeMatrix.at(row+1).at(column) == '0'&& !used.at(row+1).at(column)) {
        return std::make_tuple(row+1, column);
        //checking vertical down
    }
    else if(row >= 1 && MazeMatrix.at(row-1).at(column) == '0' && !used.at(row-1).at(column)){
        return std::make_tuple(row-1, column);
        //checking vertical up
    }
    //
    else if(column >= 1 && MazeMatrix.at(row).at(column -1) == '0' && !used.at(row).at(column-1)){
        return std::make_tuple(row,column -1);
        //checking left
    }
    else if(column+1 < MazeMatrix.at(row).size() && MazeMatrix.at(row).at(column + 1) == '0' && !used.at(row).at(column + 1)){
        return std::make_tuple(row,column + 1);
        //checking right.
    }
    else{
        return NoSuccessor;
    }
}